

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O3

void boost::checked_delete<boost::runtime::cla::rt_cla_detail::parameter_trie>(parameter_trie *x)

{
  pointer prVar1;
  
  if (x != (parameter_trie *)0x0) {
    detail::shared_count::~shared_count(&(x->m_param_candidate).pn);
    prVar1 = (x->m_id_candidates).
             super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar1 != (pointer)0x0) {
      operator_delete(prVar1,(long)(x->m_id_candidates).
                                   super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)prVar1
                     );
    }
    std::
    _Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                 *)x);
  }
  operator_delete(x,0x60);
  return;
}

Assistant:

inline void checked_delete(T * x)
{
    // intentionally complex - simplification causes regressions
    typedef char type_must_be_complete[ sizeof(T)? 1: -1 ];
    (void) sizeof(type_must_be_complete);
    delete x;
}